

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtOffsetCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  bool *__s;
  bool *pbVar5;
  bool *pbVar6;
  ostringstream buf;
  ContextType local_1cc;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  iVar1 = *(int *)((long)this + 0x128);
  pbVar6 = (bool *)0x1bfcbcf;
  pbVar5 = ::glcts::fixed_sample_locations_values + 1;
  if (iVar1 != 3) {
    pbVar6 = ::glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}",0x41);
  uVar2 = *(uint *)((long)this + 0x128);
  if (uVar2 < 3) {
    if (uVar2 == 2) {
      pbVar5 = (bool *)0x1c6abc4;
    }
    __s = (bool *)"centroid ";
    if (uVar2 != 1) {
      __s = pbVar5;
    }
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in highp vec2 v_screenPosition;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in highp vec2 v_offset;\n",0x18);
  }
  else if (uVar2 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in highp vec2[2] v_screenPosition;\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in highp vec2 v_offset;\n",0x18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n\n\thighp vec2 pixelCenter = floor(v_screenPosition"
             ,0xe3);
  lVar3 = (ulong)(iVar1 == 3) * 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pbVar6,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             ") + vec2(0.5, 0.5);\n\thighp vec2 offsetValue = interpolateAtOffset(v_screenPosition",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pbVar6,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             ", v_offset);\n\thighp vec2 refValue = pixelCenter + v_offset;\n\n\tbool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n\tif (valuesEqual)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,0xf8);
  std::__cxx11::stringbuf::str();
  local_1cc.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtOffsetCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	const char* const	arrayIndexing = (m_testType == TEST_ARRAY_ELEMENT) ? ("[1]") : ("");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_testType == TEST_QUALIFIER_NONE || m_testType == TEST_QUALIFIER_CENTROID || m_testType == TEST_QUALIFIER_SAMPLE)
	{
		const char* const qualifier = (m_testType == TEST_QUALIFIER_CENTROID) ? ("centroid ") : (m_testType == TEST_QUALIFIER_SAMPLE) ? ("sample ") : ("");
		buf	<< qualifier << "in highp vec2 v_screenPosition;\n"
			<< qualifier << "in highp vec2 v_offset;\n";
	}
	else if (m_testType == TEST_ARRAY_ELEMENT)
	{
		buf << "in highp vec2[2] v_screenPosition;\n"
			<< "in highp vec2 v_offset;\n";
	}
	else
		DE_ASSERT(false);

	buf	<<	"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	const highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n" // 0.03125 = mediump epsilon when value = 32 (RENDER_SIZE)
			"\n"
			"	highp vec2 pixelCenter = floor(v_screenPosition" << arrayIndexing << ") + vec2(0.5, 0.5);\n"
			"	highp vec2 offsetValue = interpolateAtOffset(v_screenPosition" << arrayIndexing << ", v_offset);\n"
			"	highp vec2 refValue = pixelCenter + v_offset;\n"
			"\n"
			"	bool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n"
			"	if (valuesEqual)\n"
			"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}